

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

optional<pbrt::LightLeSample> * __thiscall
pbrt::GoniometricLight::SampleLe
          (optional<pbrt::LightLeSample> *__return_storage_ptr__,GoniometricLight *this,Point2f u1,
          Point2f u2,SampledWavelengths *lambda,Float time)

{
  undefined8 uVar1;
  uintptr_t uVar2;
  undefined1 auVar3 [16];
  Point2f p;
  undefined1 in_register_00001208 [56];
  undefined1 auVar4 [64];
  undefined1 extraout_var [56];
  undefined1 auVar7 [56];
  undefined1 auVar6 [64];
  undefined1 auVar8 [64];
  Vector3f VVar10;
  SampledSpectrum SVar11;
  Float pdf;
  Ray ray;
  float local_10c;
  undefined1 local_108 [16];
  Tuple2<pbrt::Point2,_float> local_f0;
  LightLeSample local_e8;
  Ray local_50;
  undefined1 auVar5 [64];
  undefined1 auVar9 [56];
  
  auVar4._8_56_ = in_register_00001208;
  auVar4._0_8_ = u1.super_Tuple2<pbrt::Point2,_float>;
  local_f0 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar4._0_16_);
  p = PiecewiseConstant2D::Sample(&this->distrib,(Point2f *)&local_f0,&local_10c);
  auVar7 = extraout_var;
  VVar10 = EqualAreaSquareToSphere(p);
  auVar5._0_8_ = VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar7;
  local_108 = auVar5._0_16_;
  uVar2 = (this->super_LightBase).mediumInterface.outside.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  local_e8.L.values.values[0] = 0.0;
  local_e8.L.values.values[1] = 0.0;
  local_e8.L.values.values[2] = 0.0;
  uVar1 = vmovlps_avx(local_108);
  local_e8.L.values.values[3] = (float)uVar1;
  local_e8.ray.o.super_Tuple3<pbrt::Point3,_float>.x = (float)((ulong)uVar1 >> 0x20);
  local_e8.ray.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar2;
  local_e8.ray.d.super_Tuple3<pbrt::Vector3,_float>.z = (float)(uVar2 >> 0x20);
  local_e8.ray.o.super_Tuple3<pbrt::Point3,_float>.y = VVar10.super_Tuple3<pbrt::Vector3,_float>.z;
  local_e8.ray.o.super_Tuple3<pbrt::Point3,_float>.z = time;
  Transform::operator()
            (&local_50,&(this->super_LightBase).renderFromLight,(Ray *)&local_e8,(Float *)0x0);
  auVar3 = local_108;
  VVar10.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_108._0_4_;
  VVar10.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_108._4_4_;
  auVar9 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
  auVar7 = ZEXT856((ulong)local_108._8_8_);
  local_108 = auVar3;
  SVar11 = I(this,VVar10,lambda);
  auVar8._0_8_ = SVar11.values.values._8_8_;
  auVar8._8_56_ = auVar9;
  auVar6._0_8_ = SVar11.values.values._0_8_;
  auVar6._8_56_ = auVar7;
  auVar3 = vmovlhps_avx(auVar6._0_16_,auVar8._0_16_);
  local_e8.L.values.values._0_8_ = auVar3._0_8_;
  local_e8.L.values.values[2] = auVar3._8_4_;
  local_e8.L.values.values[3] = auVar3._12_4_;
  local_e8.ray.o.super_Tuple3<pbrt::Point3,_float>.x =
       local_50.o.super_Tuple3<pbrt::Point3,_float>.x;
  local_e8.ray.o.super_Tuple3<pbrt::Point3,_float>.y =
       local_50.o.super_Tuple3<pbrt::Point3,_float>.y;
  local_e8.ray.d.super_Tuple3<pbrt::Vector3,_float>.z =
       local_50.d.super_Tuple3<pbrt::Vector3,_float>.z;
  local_e8.ray.time = local_50.time;
  local_e8.ray.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = local_50.medium.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  local_e8.intr.set = false;
  local_e8.pdfPos = 1.0;
  local_e8.pdfDir = local_10c / 12.566371;
  pstd::optional<pbrt::LightLeSample>::optional(__return_storage_ptr__,&local_e8);
  pstd::optional<pbrt::Interaction>::~optional(&local_e8.intr);
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLeSample> GoniometricLight::SampleLe(Point2f u1, Point2f u2,
                                                         SampledWavelengths &lambda,
                                                         Float time) const {
    // Sample direction and PDF for ray leaving goniometric light
    Float pdf;
    Point2f uv = distrib.Sample(u1, &pdf);
    Vector3f wl = EqualAreaSquareToSphere(uv);
    Float pdfDir = pdf / (4 * Pi);

    Ray ray = renderFromLight(Ray(Point3f(0, 0, 0), wl, time, mediumInterface.outside));
    return LightLeSample(I(wl, lambda), ray, 1, pdfDir);
}